

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int32_t ra_advance_until_freeing(roaring_array_t *ra,uint16_t x,int32_t pos)

{
  bool bVar1;
  int local_18;
  int32_t pos_local;
  uint16_t x_local;
  roaring_array_t *ra_local;
  
  local_18 = pos;
  while( true ) {
    bVar1 = false;
    if (local_18 < ra->size) {
      bVar1 = ra->keys[local_18] < x;
    }
    if (!bVar1) break;
    container_free(ra->containers[local_18],ra->typecodes[local_18]);
    local_18 = local_18 + 1;
  }
  return local_18;
}

Assistant:

int32_t ra_advance_until_freeing(roaring_array_t *ra, uint16_t x, int32_t pos) {
    while (pos < ra->size && ra->keys[pos] < x) {
        container_free(ra->containers[pos], ra->typecodes[pos]);
        ++pos;
    }
    return pos;
}